

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_struct_sync_write
          (t_rs_generator *this,t_struct *tstruct,e_struct_type struct_type)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  string *__return_storage_ptr__;
  t_field *tfield;
  _Alloc_hider _Var3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  e_req req;
  t_rs_generator *this_00;
  pointer pcVar6;
  string member_var;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  undefined1 local_98 [32];
  string local_78;
  _Alloc_hider local_58;
  undefined1 local_50 [32];
  
  poVar1 = &this->f_gen_;
  this_00 = (t_rs_generator *)local_98;
  t_generator::indent_abi_cxx11_((string *)this_00,&this->super_t_generator);
  poVar5 = std::operator<<((ostream *)poVar1,(string *)this_00);
  visibility_qualifier_abi_cxx11_((string *)(local_98 + 0x20),this_00,struct_type);
  poVar5 = std::operator<<(poVar5,(string *)(local_98 + 0x20));
  poVar5 = std::operator<<(poVar5,
                           "fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_98 + 0x20));
  std::__cxx11::string::~string((string *)local_98);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar5 = std::operator<<((ostream *)poVar1,(string *)local_98);
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "let struct_ident = TStructIdentifier::new(\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar4));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_98 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "\");");
  poVar5 = std::operator<<(poVar5,(string *)(local_98 + 0x20));
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_98 + 0x20));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_98);
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  local_58._M_p = (pointer)poVar1;
  poVar5 = std::operator<<((ostream *)poVar1,(string *)local_98);
  poVar5 = std::operator<<(poVar5,"o_prot.write_struct_begin(&struct_ident)?;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_98);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)local_50,
             &tstruct->members_in_id_order_);
  if (local_50._0_8_ != local_50._8_8_) {
    __return_storage_ptr__ = (string *)(local_98 + 0x20);
    for (pcVar6 = (pointer)local_50._0_8_; pcVar6 != (pointer)local_50._8_8_; pcVar6 = pcVar6 + 8) {
      req = T_REQUIRED;
      tfield = *(t_field **)pcVar6;
      if (struct_type != T_ARGS) {
        req = tfield->req_;
      }
      rust_field_name_abi_cxx11_(__return_storage_ptr__,this,tfield);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "self.",__return_storage_ptr__);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      render_struct_field_sync_write
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 false,tfield,req);
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  _Var3._M_p = local_58._M_p;
  poVar5 = std::operator<<((ostream *)local_58._M_p,(string *)local_98);
  poVar5 = std::operator<<(poVar5,"o_prot.write_field_stop()?;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_98);
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar5 = std::operator<<((ostream *)_Var3._M_p,(string *)local_98);
  poVar5 = std::operator<<(poVar5,"o_prot.write_struct_end()");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_98);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_((string *)local_98,&this->super_t_generator);
  poVar5 = std::operator<<((ostream *)_Var3._M_p,(string *)local_98);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_98);
  std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base
            ((_Vector_base<t_field_*,_std::allocator<t_field_*>_> *)local_50);
  return;
}

Assistant:

void t_rs_generator::render_struct_sync_write(
    t_struct *tstruct,
    t_rs_generator::e_struct_type struct_type
) {
  f_gen_
    << indent()
    << visibility_qualifier(struct_type)
    << "fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
    << endl;
  indent_up();

  // write struct header to output protocol
  // note: use the *original* struct name here
  f_gen_ << indent() << "let struct_ident = TStructIdentifier::new(\"" + tstruct->get_name() + "\");" << endl;
  f_gen_ << indent() << "o_prot.write_struct_begin(&struct_ident)?;" << endl;

  // write struct members to output protocol
  vector<t_field*> members = tstruct->get_sorted_members();
  if (!members.empty()) {
    vector<t_field*>::iterator members_iter;
    for(members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field* member = (*members_iter);
      t_field::e_req member_req = actual_field_req(member, struct_type);
      string member_var("self." + rust_field_name(member));
      render_struct_field_sync_write(member_var, false, member, member_req);
    }
  }

  // write struct footer to output protocol
  f_gen_ << indent() << "o_prot.write_field_stop()?;" << endl;
  f_gen_ << indent() << "o_prot.write_struct_end()" << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
}